

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrdb.cpp
# Opt level: O2

vector<CAddress,_std::allocator<CAddress>_> *
ReadAnchors(vector<CAddress,_std::allocator<CAddress>_> *__return_storage_ptr__,
           path *anchors_db_path)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  FILE *pFVar3;
  CChainParams *pCVar4;
  Logger *pLVar5;
  runtime_error *this;
  code *pcVar6;
  pointer_____offset_0x10___ *ppuVar7;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  *in_R8;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  long local_188 [2];
  string *local_178;
  undefined2 local_170;
  MessageStartChars pchMsgTmp;
  HashVerifier<AutoFile> verifier;
  SerParams *local_d8;
  vector<CAddress,_std::allocator<CAddress>_> *local_d0;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_b8;
  AutoFile local_98;
  string local_78;
  uint256 hashTmp;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8 = &CAddress::V2_DISK;
  local_d0 = __return_storage_ptr__;
  pFVar3 = fsbridge::fopen((char *)anchors_db_path,"rb");
  local_98.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.m_file = (FILE *)pFVar3;
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_b8);
  if (pFVar3 == (FILE *)0x0) {
    this = (runtime_error *)__cxa_allocate_exception(8);
    *(undefined ***)this = &PTR__exception_00a24940;
    pcVar6 = std::exception::~exception;
    ppuVar7 = &(anonymous_namespace)::DbNotFoundError::typeinfo;
  }
  else {
    CSHA256::CSHA256((CSHA256 *)&verifier);
    verifier.m_source = &local_98;
    Unserialize<HashVerifier<AutoFile>,_unsigned_char,_4UL>(&verifier,&pchMsgTmp);
    pCVar4 = Params();
    bVar2 = std::operator==(&pchMsgTmp,&pCVar4->pchMessageStart);
    if (bVar2) {
      ParamsWrapper<CAddress::SerParams,std::vector<CAddress,std::allocator<CAddress>>>::
      Unserialize<HashVerifier<AutoFile>>
                ((ParamsWrapper<CAddress::SerParams,std::vector<CAddress,std::allocator<CAddress>>>
                  *)&local_d8,&verifier);
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      base_blob<256U>::Unserialize<AutoFile>(&hashTmp.super_base_blob<256U>,&local_98);
      HashWriter::GetHash((uint256 *)&local_78,&verifier.super_HashWriter);
      bVar2 = operator!=(&hashTmp.super_base_blob<256U>,(base_blob<256U> *)&local_78);
      if (!bVar2) {
        AutoFile::~AutoFile(&local_98);
        local_188[0] = ((long)(__return_storage_ptr__->
                              super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(__return_storage_ptr__->
                             super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                             super__Vector_impl_data._M_start) / 0x38;
        fs::path::filename((path *)&verifier,anchors_db_path);
        std::filesystem::__cxx11::path::string((string *)&pchMsgTmp,(path *)&verifier);
        local_170 = 0x2622;
        local_178 = (string *)&pchMsgTmp;
        pLVar5 = LogInstance();
        bVar2 = BCLog::Logger::Enabled(pLVar5);
        if (bVar2) {
          hashTmp.super_base_blob<256U>.m_data._M_elems._0_8_ =
               hashTmp.super_base_blob<256U>.m_data._M_elems + 0x10;
          hashTmp.super_base_blob<256U>.m_data._M_elems[8] = '\0';
          hashTmp.super_base_blob<256U>.m_data._M_elems[9] = '\0';
          hashTmp.super_base_blob<256U>.m_data._M_elems[10] = '\0';
          hashTmp.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
          hashTmp.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
          hashTmp.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
          hashTmp.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
          hashTmp.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
          hashTmp.super_base_blob<256U>.m_data._M_elems._16_8_ =
               hashTmp.super_base_blob<256U>.m_data._M_elems._16_8_ & 0xffffffffffffff00;
          tinyformat::
          format<unsigned_long,std::__detail::_Quoted_string<std::__cxx11::string_const&,char>>
                    (&local_78,(tinyformat *)"Loaded %i addresses from %s\n",(char *)local_188,
                     (unsigned_long *)&local_178,in_R8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&hashTmp,
                     &local_78);
          std::__cxx11::string::~string((string *)&local_78);
          pLVar5 = LogInstance();
          local_78._M_dataplus._M_p = (pointer)0x53;
          local_78._M_string_length = 0x6debf0;
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrdb.cpp"
          ;
          source_file._M_len = 0x53;
          str._M_str = (char *)hashTmp.super_base_blob<256U>.m_data._M_elems._0_8_;
          str._M_len._0_1_ = hashTmp.super_base_blob<256U>.m_data._M_elems[8];
          str._M_len._1_1_ = hashTmp.super_base_blob<256U>.m_data._M_elems[9];
          str._M_len._2_1_ = hashTmp.super_base_blob<256U>.m_data._M_elems[10];
          str._M_len._3_1_ = hashTmp.super_base_blob<256U>.m_data._M_elems[0xb];
          str._M_len._4_1_ = hashTmp.super_base_blob<256U>.m_data._M_elems[0xc];
          str._M_len._5_1_ = hashTmp.super_base_blob<256U>.m_data._M_elems[0xd];
          str._M_len._6_1_ = hashTmp.super_base_blob<256U>.m_data._M_elems[0xe];
          str._M_len._7_1_ = hashTmp.super_base_blob<256U>.m_data._M_elems[0xf];
          logging_function._M_str = "ReadAnchors";
          logging_function._M_len = 0xb;
          BCLog::Logger::LogPrintStr(pLVar5,str,logging_function,source_file,0xea,ALL,Info);
          std::__cxx11::string::~string((string *)&hashTmp);
        }
        std::__cxx11::string::~string((string *)&pchMsgTmp);
        std::filesystem::__cxx11::path::~path((path *)&verifier);
        std::filesystem::remove(&anchors_db_path->super_path);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          return __return_storage_ptr__;
        }
        goto LAB_0039b5f2;
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Checksum mismatch, data corrupted");
    }
    else {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Invalid network magic number");
    }
    pcVar6 = std::runtime_error::~runtime_error;
    ppuVar7 = (pointer_____offset_0x10___ *)&std::runtime_error::typeinfo;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    __cxa_throw(this,ppuVar7,pcVar6);
  }
LAB_0039b5f2:
  __stack_chk_fail();
}

Assistant:

std::vector<CAddress> ReadAnchors(const fs::path& anchors_db_path)
{
    std::vector<CAddress> anchors;
    try {
        DeserializeFileDB(anchors_db_path, CAddress::V2_DISK(anchors));
        LogPrintf("Loaded %i addresses from %s\n", anchors.size(), fs::quoted(fs::PathToString(anchors_db_path.filename())));
    } catch (const std::exception&) {
        anchors.clear();
    }

    fs::remove(anchors_db_path);
    return anchors;
}